

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qringbuffer.cpp
# Opt level: O0

ssize_t __thiscall QRingBuffer::read(QRingBuffer *this,int __fd,void *__buf,size_t __nbytes)

{
  long lVar1;
  void *__ptr;
  longlong *plVar2;
  char *__src;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  qint64 bytesToReadFromThisBlock;
  qint64 readSoFar;
  qint64 bytesToRead;
  QRingBuffer *in_stack_ffffffffffffffa0;
  long local_48;
  qint64 local_28;
  long local_20;
  qint64 local_18;
  void *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = __buf;
  local_18 = size(this);
  plVar2 = qMin<long_long>(&local_18,(longlong *)&local_10);
  lVar1 = *plVar2;
  local_48 = 0;
  while (local_48 < lVar1) {
    local_20 = lVar1 - local_48;
    local_28 = nextDataBlockSize(in_stack_ffffffffffffffa0);
    plVar2 = qMin<long_long>(&local_20,&local_28);
    __ptr = (void *)*plVar2;
    if (CONCAT44(in_register_00000034,__fd) != 0) {
      in_stack_ffffffffffffffa0 = (QRingBuffer *)(CONCAT44(in_register_00000034,__fd) + local_48);
      __src = readPointer(in_stack_ffffffffffffffa0);
      memcpy(in_stack_ffffffffffffffa0,__src,(size_t)__ptr);
    }
    local_48 = (long)__ptr + local_48;
    free(this,__ptr);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_48;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QRingBuffer::read(char *data, qint64 maxLength)
{
    const qint64 bytesToRead = qMin(size(), maxLength);
    qint64 readSoFar = 0;
    while (readSoFar < bytesToRead) {
        const qint64 bytesToReadFromThisBlock = qMin(bytesToRead - readSoFar,
                                                     nextDataBlockSize());
        if (data)
            memcpy(data + readSoFar, readPointer(), bytesToReadFromThisBlock);
        readSoFar += bytesToReadFromThisBlock;
        free(bytesToReadFromThisBlock);
    }
    return readSoFar;
}